

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automatic.c
# Opt level: O0

void icetAutomaticCompose
               (IceTInt *compose_group,IceTInt group_size,IceTInt image_dest,
               IceTSparseImage input_image,IceTSparseImage *result_image,IceTSizeType *piece_offset)

{
  IceTSizeType *piece_offset_local;
  IceTSparseImage *result_image_local;
  IceTInt image_dest_local;
  IceTInt group_size_local;
  IceTInt *compose_group_local;
  IceTSparseImage input_image_local;
  
  if (group_size < 8) {
    if (group_size < 1) {
      icetClearSparseImage(input_image);
      result_image->opaque_internals = (IceTVoid *)input_image;
    }
    else {
      icetInvokeSingleImageStrategy
                (0x7003,compose_group,group_size,image_dest,input_image,result_image,piece_offset);
    }
  }
  else {
    icetInvokeSingleImageStrategy
              (0x7002,compose_group,group_size,image_dest,input_image,result_image,piece_offset);
  }
  return;
}

Assistant:

void icetAutomaticCompose(const IceTInt *compose_group,
                          IceTInt group_size,
                          IceTInt image_dest,
                          IceTSparseImage input_image,
                          IceTSparseImage *result_image,
                          IceTSizeType *piece_offset)
{
    if (group_size >= 8) {
	icetRaiseDebug("Doing bswap compose");
        icetInvokeSingleImageStrategy(ICET_SINGLE_IMAGE_STRATEGY_BSWAP,
                                      compose_group,
                                      group_size,
                                      image_dest,
                                      input_image,
                                      result_image,
                                      piece_offset);
    } else if (group_size > 0) {
	icetRaiseDebug("Doing tree compose");
        icetInvokeSingleImageStrategy(ICET_SINGLE_IMAGE_STRATEGY_TREE,
                                      compose_group,
                                      group_size,
                                      image_dest,
                                      input_image,
                                      result_image,
                                      piece_offset);
    } else {
	icetRaiseDebug("Clearing pixels");
        icetClearSparseImage(input_image);
        *result_image = input_image;
    }
}